

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall
wasm::Wasm2JSBuilder::Wasm2JSBuilder(Wasm2JSBuilder *this,Flags *f,PassOptions *options_)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  undefined4 uVar8;
  __node_base_ptr *pp_Var9;
  __node_base_ptr *pp_Var10;
  long lVar11;
  PassOptions *pPVar12;
  PassOptions *pPVar13;
  byte bVar14;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
  local_38;
  __alloc_node_gen_t __alloc_node_gen;
  
  bVar14 = 0;
  (this->dataIndices)._M_h._M_buckets = &(this->dataIndices)._M_h._M_single_bucket;
  (this->dataIndices)._M_h._M_bucket_count = 1;
  (this->dataIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataIndices)._M_h._M_element_count = 0;
  (this->dataIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar3 = f->pedantic;
  bVar4 = f->allowAsserts;
  bVar5 = f->emscripten;
  (this->flags).debug = f->debug;
  (this->flags).pedantic = bVar3;
  (this->flags).allowAsserts = bVar4;
  (this->flags).emscripten = bVar5;
  (this->flags).deterministic = f->deterministic;
  (this->flags).symbolsFile._M_dataplus._M_p = (pointer)&(this->flags).symbolsFile.field_2;
  pcVar1 = (f->symbolsFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->flags).symbolsFile,pcVar1,pcVar1 + (f->symbolsFile)._M_string_length)
  ;
  pPVar12 = options_;
  pPVar13 = &this->options;
  for (lVar11 = 8; lVar11 != 0; lVar11 = lVar11 + -1) {
    bVar3 = pPVar12->validate;
    bVar4 = pPVar12->validateGlobally;
    uVar6 = pPVar12->field_0x3;
    iVar7 = pPVar12->optimizeLevel;
    pPVar13->debug = pPVar12->debug;
    pPVar13->validate = bVar3;
    pPVar13->validateGlobally = bVar4;
    pPVar13->field_0x3 = uVar6;
    pPVar13->optimizeLevel = iVar7;
    pPVar12 = (PassOptions *)((long)pPVar12 + (ulong)bVar14 * -0x10 + 8);
    pPVar13 = (PassOptions *)((long)pPVar13 + (ulong)bVar14 * -0x10 + 8);
  }
  (this->options).targetJS = options_->targetJS;
  local_38._M_h = (__hashtable_alloc *)&(this->options).arguments;
  (this->options).arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).arguments._M_h._M_bucket_count = (options_->arguments)._M_h._M_bucket_count;
  (this->options).arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).arguments._M_h._M_element_count = (options_->arguments)._M_h._M_element_count;
  uVar8 = *(undefined4 *)&(options_->arguments)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (options_->arguments)._M_h._M_rehash_policy._M_next_resize;
  (this->options).arguments._M_h._M_rehash_policy._M_max_load_factor =
       (options_->arguments)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).arguments._M_h._M_rehash_policy.field_0x4 = uVar8;
  (this->options).arguments._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->options).arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_38._M_h,&(options_->arguments)._M_h,&local_38);
  local_38._M_h = (__hashtable_alloc *)&(this->options).passesToSkip;
  (this->options).passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options).passesToSkip._M_h._M_bucket_count = (options_->passesToSkip)._M_h._M_bucket_count;
  (this->options).passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options).passesToSkip._M_h._M_element_count =
       (options_->passesToSkip)._M_h._M_element_count;
  uVar8 = *(undefined4 *)&(options_->passesToSkip)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (options_->passesToSkip)._M_h._M_rehash_policy._M_next_resize;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
       (options_->passesToSkip)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options).passesToSkip._M_h._M_rehash_policy.field_0x4 = uVar8;
  (this->options).passesToSkip._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->options).passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_38._M_h,&(options_->passesToSkip)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_38);
  (this->temps)._M_h._M_buckets = &(this->temps)._M_h._M_single_bucket;
  (this->temps)._M_h._M_bucket_count = 1;
  (this->temps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->temps)._M_h._M_element_count = 0;
  (this->temps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->temps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->temps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->frees)._M_h._M_buckets = &(this->frees)._M_h._M_single_bucket;
  (this->frees)._M_h._M_bucket_count = 1;
  (this->frees)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->frees)._M_h._M_element_count = 0;
  (this->frees)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->frees)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->frees)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pp_Var9 = &this->wasmNameToMangledName[0]._M_h._M_single_bucket;
  lVar11 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var9 + -6))->_M_buckets = pp_Var9;
    pp_Var9[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var9 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var9[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var9 + -2))->_M_max_load_factor = 1.0;
    pp_Var9[-1] = (__node_base_ptr)0x0;
    *pp_Var9 = (__node_base_ptr)0x0;
    pp_Var9 = pp_Var9 + 7;
    lVar11 = lVar11 + -0x38;
  } while (lVar11 != 0);
  pp_Var10 = &this->mangledNames[0]._M_h._M_single_bucket;
  lVar11 = 0xe0;
  do {
    ((_Hashtable *)(pp_Var10 + -6))->_M_buckets = pp_Var10;
    pp_Var10[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var10 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var10[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var10 + -2))->_M_max_load_factor = 1.0;
    pp_Var10[-1] = (__node_base_ptr)0x0;
    *pp_Var10 = (__node_base_ptr)0x0;
    pp_Var10 = pp_Var10 + 7;
    lVar11 = lVar11 + -0x38;
  } while (lVar11 != 0);
  (this->seenModuleImports)._M_h._M_buckets = &(this->seenModuleImports)._M_h._M_single_bucket;
  (this->seenModuleImports)._M_h._M_bucket_count = 1;
  (this->seenModuleImports)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->seenModuleImports)._M_h._M_element_count = 0;
  (this->seenModuleImports)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->seenModuleImports)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->seenModuleImports)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->functionsCallableFromOutside)._M_h._M_buckets =
       &(this->functionsCallableFromOutside)._M_h._M_single_bucket;
  (this->functionsCallableFromOutside)._M_h._M_bucket_count = 1;
  (this->functionsCallableFromOutside)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionsCallableFromOutside)._M_h._M_element_count = 0;
  (this->functionsCallableFromOutside)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionsCallableFromOutside)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionsCallableFromOutside)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < (this->options).optimizeLevel) {
    (this->options).ignoreImplicitTraps = true;
    (this->options).targetJS = true;
  }
  return;
}

Assistant:

Wasm2JSBuilder(Flags f, PassOptions options_) : flags(f), options(options_) {
    // We don't try to model wasm's trapping precisely - if we did, each load
    // and store would need to do a check. Given that, we can just ignore
    // implicit traps like those when optimizing. (When not optimizing, it's
    // nice to see codegen that matches wasm more precisely.)
    // It is also important to prevent the optimizer from adding new things that
    // require additional lowering, as we could hit a cycle.
    if (options.optimizeLevel > 0) {
      options.ignoreImplicitTraps = true;
      options.targetJS = true;
    }
  }